

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

int __thiscall spvtools::val::Function::GetBlockDepth(Function *this,BasicBlock *bb)

{
  unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
  *this_00;
  Construct *this_01;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  int *piVar4;
  mapped_type bb_00;
  mapped_type *ppCVar5;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *pvVar6;
  BasicBlock *pBVar7;
  mapped_type *ppBVar8;
  mapped_type *pmVar9;
  BasicBlock *bb_local;
  key_type local_38;
  
  if (bb == (BasicBlock *)0x0) {
    return 0;
  }
  this_00 = &this->block_depth_;
  bb_local = bb;
  iVar3 = std::
          _Hashtable<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_int>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&bb_local);
  piVar4 = std::__detail::
           _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_int>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_int>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&bb_local);
  if (iVar3.super__Node_iterator_base<std::pair<spvtools::val::BasicBlock_*const,_int>,_false>.
      _M_cur != (__node_type *)0x0) goto LAB_001cd822;
  *piVar4 = 0;
  bb_00 = BasicBlock::immediate_dominator(bb_local);
  iVar2 = 0;
  if ((bb_00 != (BasicBlock *)0x0) && (iVar2 = 0, bb_local != bb_00)) {
    bVar1 = std::bitset<7UL>::test(&bb_local->type_,5);
    if (bVar1) {
      local_38.first = bb_local;
      local_38.second = kContinue;
      ppCVar5 = std::__detail::
                _Map_base<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_spvtools::val::bb_constr_type_pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_spvtools::val::bb_constr_type_pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->entry_block_to_construct_,&local_38);
      if (*ppCVar5 == (Construct *)0x0) {
        __assert_fail("continue_construct",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                      ,0x156,"int spvtools::val::Function::GetBlockDepth(BasicBlock *)");
      }
      pvVar6 = Construct::corresponding_constructs(*ppCVar5);
      this_01 = *(pvVar6->
                 super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if (this_01 == (Construct *)0x0) {
        __assert_fail("loop_construct",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                      ,0x15a,"int spvtools::val::Function::GetBlockDepth(BasicBlock *)");
      }
      pBVar7 = Construct::entry_block(this_01);
      if (pBVar7 != bb_local) {
        bb_00 = pBVar7;
      }
LAB_001cd7ed:
      iVar2 = GetBlockDepth(this,bb_00);
      iVar2 = iVar2 + 1;
    }
    else {
      bVar1 = std::bitset<7UL>::test(&bb_local->type_,3);
      if (bVar1) {
        ppBVar8 = std::__detail::
                  _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->merge_block_header_,&bb_local);
        bb_00 = *ppBVar8;
        if (bb_00 == (mapped_type)0x0) {
          __assert_fail("header",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                        ,0x168,"int spvtools::val::Function::GetBlockDepth(BasicBlock *)");
        }
      }
      else {
        bVar1 = std::bitset<7UL>::test(&bb_00->type_,1);
        if ((bVar1) || (bVar1 = std::bitset<7UL>::test(&bb_00->type_,2), bVar1)) goto LAB_001cd7ed;
      }
      iVar2 = GetBlockDepth(this,bb_00);
    }
  }
  pmVar9 = std::__detail::
           _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_int>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_int>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&bb_local);
  *pmVar9 = iVar2;
  piVar4 = std::__detail::
           _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_int>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_int>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&bb_local);
LAB_001cd822:
  return *piVar4;
}

Assistant:

int Function::GetBlockDepth(BasicBlock* bb) {
  // Guard against nullptr.
  if (!bb) {
    return 0;
  }
  // Only calculate the depth if it's not already calculated.
  // This function uses memoization to avoid duplicate CFG depth calculations.
  if (block_depth_.find(bb) != block_depth_.end()) {
    return block_depth_[bb];
  }
  // Avoid recursion. Something is wrong if the same block is encountered
  // multiple times.
  block_depth_[bb] = 0;

  BasicBlock* bb_dom = bb->immediate_dominator();
  if (!bb_dom || bb == bb_dom) {
    // This block has no dominator, so it's at depth 0.
    block_depth_[bb] = 0;
  } else if (bb->is_type(kBlockTypeContinue)) {
    // This rule must precede the rule for merge blocks in order to set up
    // depths correctly. If a block is both a merge and continue then the merge
    // is nested within the continue's loop (or the graph is incorrect).
    // The depth of the continue block entry point is 1 + loop header depth.
    Construct* continue_construct =
        entry_block_to_construct_[std::make_pair(bb, ConstructType::kContinue)];
    assert(continue_construct);
    // Continue construct has only 1 corresponding construct (loop header).
    Construct* loop_construct =
        continue_construct->corresponding_constructs()[0];
    assert(loop_construct);
    BasicBlock* loop_header = loop_construct->entry_block();
    // The continue target may be the loop itself (while 1).
    // In such cases, the depth of the continue block is: 1 + depth of the
    // loop's dominator block.
    if (loop_header == bb) {
      block_depth_[bb] = 1 + GetBlockDepth(bb_dom);
    } else {
      block_depth_[bb] = 1 + GetBlockDepth(loop_header);
    }
  } else if (bb->is_type(kBlockTypeMerge)) {
    // If this is a merge block, its depth is equal to the block before
    // branching.
    BasicBlock* header = merge_block_header_[bb];
    assert(header);
    block_depth_[bb] = GetBlockDepth(header);
  } else if (bb_dom->is_type(kBlockTypeSelection) ||
             bb_dom->is_type(kBlockTypeLoop)) {
    // The dominator of the given block is a header block. So, the nesting
    // depth of this block is: 1 + nesting depth of the header.
    block_depth_[bb] = 1 + GetBlockDepth(bb_dom);
  } else {
    block_depth_[bb] = GetBlockDepth(bb_dom);
  }
  return block_depth_[bb];
}